

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrq.cc
# Opt level: O1

void predict_or_learn<false>(LRQstate *lrq,single_learner *base,example *ec)

{
  size_t *__s;
  features *this;
  float fVar1;
  byte bVar2;
  byte bVar3;
  vw *pvVar4;
  byte *pbVar5;
  long lVar6;
  vw *pvVar7;
  element_type *peVar8;
  bool bVar9;
  uint uVar10;
  byte *pbVar11;
  uint32_t *puVar12;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  weight *pwVar13;
  ostream *poVar14;
  char *pcVar15;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  _Base_ptr p_Var16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined8 uVar21;
  float fVar22;
  char *new_feature;
  char *new_space;
  stringstream new_feature_buffer;
  ulong local_278;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  element_type local_228;
  ulong local_1e8;
  long local_1e0;
  float *local_1d8;
  long local_1d0;
  char *local_1c8;
  char *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  pvVar4 = lrq->all;
  __s = lrq->orig_size;
  local_228.first.field_2._M_allocated_capacity = (size_type)base;
  memset(__s,0,0x800);
  pbVar5 = (ec->super_example_predict).indices._end;
  for (pbVar11 = (ec->super_example_predict).indices._begin; pbVar11 != pbVar5;
      pbVar11 = (byte *)((long)pbVar11 + 1)) {
    bVar2 = *pbVar11;
    if (lrq->lrindices[bVar2] == true) {
      __s[bVar2] = (long)(ec->super_example_predict).feature_space[bVar2].values._end -
                   (long)(ec->super_example_predict).feature_space[bVar2].values._begin >> 2;
    }
  }
  if (lrq->dropout == false) {
    fVar22 = 1.0;
  }
  else {
    fVar22 = 0.5;
  }
  uVar21 = &(lrq->lrpairs)._M_t._M_impl.super__Rb_tree_header;
  puVar12 = &(pvVar4->weights).dense_weights._stride_shift;
  if ((pvVar4->weights).sparse != false) {
    puVar12 = &(pvVar4->weights).sparse_weights._stride_shift;
  }
  p_Var16 = (lrq->lrpairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  uVar17 = (uint)ec->example_counter;
  if (p_Var16 != (_Base_ptr)uVar21) {
    local_1e8 = (ulong)*puVar12;
    local_228.second._M_string_length = (size_type)(uVar17 & 1);
    local_228.second._M_dataplus._M_p = (pointer)(local_228.second._M_string_length ^ 1);
    local_228.first.field_2._8_8_ = uVar21;
    do {
      lVar6 = *(long *)(p_Var16 + 1);
      bVar2 = *(byte *)(lVar6 + local_228.second._M_string_length);
      bVar3 = local_228.second._M_dataplus._M_p[lVar6];
      local_228.second.field_2._M_allocated_capacity = (size_type)p_Var16;
      uVar10 = atoi((char *)(lVar6 + 2));
      if (__s[bVar2] != 0) {
        local_228.second.field_2._8_8_ = (ec->super_example_predict).feature_space + bVar2;
        this = (ec->super_example_predict).feature_space + bVar3;
        this_00 = &(ec->super_example_predict).feature_space[bVar3].space_names;
        local_278 = 0;
        do {
          if (uVar10 != 0) {
            local_1e0 = (ec->super_example_predict).ft_offset +
                        ((v_array<unsigned_long> *)(local_228.second.field_2._8_8_ + 0x20))->_begin
                        [local_278];
            fVar1 = *(float *)(*(long *)local_228.second.field_2._8_8_ + local_278 * 4);
            uVar18 = 1;
            do {
              local_1d0 = (ulong)uVar18 << ((byte)local_1e8 & 0x3f);
              pvVar7 = lrq->all;
              if ((pvVar7->weights).sparse == true) {
                pwVar13 = sparse_parameters::operator[]
                                    (&(pvVar7->weights).sparse_weights,local_1e0 + local_1d0);
              }
              else {
                pwVar13 = (pvVar7->weights).dense_weights._begin +
                          (local_1e0 + local_1d0 & (pvVar7->weights).dense_weights._weight_mask);
              }
              if (__s[bVar3] != 0) {
                uVar19 = 0;
                uVar20 = 1;
                local_1d8 = pwVar13;
                do {
                  features::push_back(this,*local_1d8 * fVar22 * fVar1 *
                                           (this->values)._begin[uVar19],
                                      (this->indicies)._begin[uVar19] + local_1d0);
                  if ((pvVar4->audit != false) || (pvVar4->hash_inv == true)) {
                    std::__cxx11::stringstream::stringstream(local_1b8);
                    local_238.
                    super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr._0_1_ = bVar3;
                    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1a8,(char *)&local_238,1);
                    local_238.
                    super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr._0_1_ = 0x5e;
                    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar14,(char *)&local_238,1);
                    peVar8 = this_00->_begin[uVar19].
                             super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr;
                    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar14,(peVar8->second)._M_dataplus._M_p,
                                         (peVar8->second)._M_string_length);
                    local_238.
                    super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)
                              CONCAT71(local_238.
                                       super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr._1_7_,0x5e);
                    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar14,(char *)&local_238,1);
                    std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
                    local_1c0 = strdup("lrq");
                    std::__cxx11::stringbuf::str();
                    peVar8 = local_238.
                             super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr;
                    pcVar15 = strdup((char *)local_238.
                                             super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr);
                    if (peVar8 != &local_228) {
                      operator_delete(peVar8);
                    }
                    local_1c8 = pcVar15;
                    this_01 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)operator_new(0x40);
                    std::
                    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::pair<char_*&,_char_*&,_true>(this_01,&local_1c0,&local_1c8);
                    local_238.
                    super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = this_01;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<std::pair<std::__cxx11::string,std::__cxx11::string>*>
                              (&local_238.
                                super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,this_01);
                    v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::push_back(this_00,&local_238);
                    if (local_238.
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_238.
                                 super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
                    }
                    std::__cxx11::stringstream::~stringstream(local_1b8);
                    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                  }
                  bVar9 = uVar20 < __s[bVar3];
                  uVar19 = uVar20;
                  uVar20 = (ulong)((int)uVar20 + 1);
                } while (bVar9);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 <= uVar10);
          }
          local_278 = (ulong)((int)local_278 + 1);
        } while (local_278 < __s[bVar2]);
      }
      p_Var16 = (_Base_ptr)
                std::_Rb_tree_increment
                          ((_Rb_tree_node_base *)local_228.second.field_2._M_allocated_capacity);
      uVar21 = local_228.first.field_2._8_8_;
    } while (p_Var16 != (_Base_ptr)local_228.first.field_2._8_8_);
  }
  (**(code **)(local_228.first.field_2._M_allocated_capacity + 0x30))
            (*(undefined8 *)(local_228.first.field_2._M_allocated_capacity + 0x18),
             *(undefined8 *)(local_228.first.field_2._M_allocated_capacity + 0x20),ec);
  p_Var16 = (lrq->lrpairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var16 != (_Base_ptr)uVar21) {
    do {
      bVar2 = *(byte *)(*(long *)(p_Var16 + 1) + (ulong)(~uVar17 & 1));
      features::truncate_to((ec->super_example_predict).feature_space + bVar2,__s[bVar2]);
      p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
    } while (p_Var16 != (_Base_ptr)uVar21);
  }
  return;
}

Assistant:

void predict_or_learn(LRQstate& lrq, single_learner& base, example& ec)
{
  vw& all = *lrq.all;

  // Remember original features

  memset(lrq.orig_size, 0, sizeof(lrq.orig_size));
  for (namespace_index i : ec.indices)
  {
    if (lrq.lrindices[i])
      lrq.orig_size[i] = ec.feature_space[i].size();
  }

  size_t which = ec.example_counter;
  float first_prediction = 0;
  float first_loss = 0;
  float first_uncertainty = 0;
  unsigned int maxiter = (is_learn && !example_is_test(ec)) ? 2 : 1;

  bool do_dropout = lrq.dropout && is_learn && !example_is_test(ec);
  float scale = (!lrq.dropout || do_dropout) ? 1.f : 0.5f;

  uint32_t stride_shift = lrq.all->weights.stride_shift();
  for (unsigned int iter = 0; iter < maxiter; ++iter, ++which)
  {
    // Add left LRQ features, holding right LRQ features fixed
    //     and vice versa
    // TODO: what happens with --lrq ab2 --lrq ac2
    //       i.e. namespace occurs multiple times (?)

    for (string const& i : lrq.lrpairs)
    {
      unsigned char left = i[which % 2];
      unsigned char right = i[(which + 1) % 2];
      unsigned int k = atoi(i.c_str() + 2);

      features& left_fs = ec.feature_space[left];
      for (unsigned int lfn = 0; lfn < lrq.orig_size[left]; ++lfn)
      {
        float lfx = left_fs.values[lfn];
        uint64_t lindex = left_fs.indicies[lfn] + ec.ft_offset;
        for (unsigned int n = 1; n <= k; ++n)
        {
          if (!do_dropout || cheesyrbit(lrq.seed))
          {
            uint64_t lwindex = (lindex + ((uint64_t)n << stride_shift));
            weight* lw = &lrq.all->weights[lwindex];

            // perturb away from saddle point at (0, 0)
            if (is_learn && !example_is_test(ec) && *lw == 0)
              *lw = cheesyrand(lwindex);  // not sure if lw needs a weight mask?

            features& right_fs = ec.feature_space[right];
            for (unsigned int rfn = 0; rfn < lrq.orig_size[right]; ++rfn)
            {
              // NB: ec.ft_offset added by base learner
              float rfx = right_fs.values[rfn];
              uint64_t rindex = right_fs.indicies[rfn];
              uint64_t rwindex = (rindex + ((uint64_t)n << stride_shift));

              right_fs.push_back(scale * *lw * lfx * rfx, rwindex);

              if (all.audit || all.hash_inv)
              {
                std::stringstream new_feature_buffer;
                new_feature_buffer << right << '^' << right_fs.space_names[rfn].get()->second << '^' << n;

#ifdef _WIN32
                char* new_space = _strdup("lrq");
                char* new_feature = _strdup(new_feature_buffer.str().c_str());
#else
                char* new_space = strdup("lrq");
                char* new_feature = strdup(new_feature_buffer.str().c_str());
#endif
                right_fs.space_names.push_back(audit_strings_ptr(new audit_strings(new_space, new_feature)));
              }
            }
          }
        }
      }
    }

    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);

    // Restore example
    if (iter == 0)
    {
      first_prediction = ec.pred.scalar;
      first_loss = ec.loss;
      first_uncertainty = ec.confidence;
    }
    else
    {
      ec.pred.scalar = first_prediction;
      ec.loss = first_loss;
      ec.confidence = first_uncertainty;
    }

    for (string const& i : lrq.lrpairs)
    {
      unsigned char right = i[(which + 1) % 2];
      ec.feature_space[right].truncate_to(lrq.orig_size[right]);
    }
  }
}